

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManFormulaUnfold(Gia_Man_t *p,char *pForm,int fFfOnly)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int nPars;
  int iFans [2];
  int nVars;
  int iCtrl [8];
  char pStr [100];
  uint local_dc;
  uint local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  int local_bc;
  int local_b8 [8];
  char local_98 [104];
  
  sVar5 = strlen(pForm);
  if (99 < sVar5) {
    __assert_fail("strlen(pForm) < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrCount(pForm,&local_bc,(int *)&local_d4);
  if (local_bc != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34f,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrTransform(local_98,pForm);
  Gia_ManPrintFormula(local_98);
  p_00 = Gia_ManStart(p->nObjs * 5);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar9 = 0; iVar9 < p->vCis->nSize; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCi(p,iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar7->Value = uVar1;
  }
  if (fFfOnly == 0) {
    local_c8 = 0;
    local_dc = local_d4;
    uVar10 = 0;
    if (0 < (int)local_d4) {
      uVar10 = (ulong)local_d4;
    }
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar7 = Gia_ManObj(p,iVar9);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          iVar2 = Gia_ManAppendCi(p_00);
          local_b8[uVar11] = iVar2;
        }
        local_d0 = Gia_ObjFanin0Copy(pGVar7);
        local_cc = Gia_ObjFanin1Copy(pGVar7);
        uVar1 = Gia_ManRealizeFormula(p_00,&local_d0,local_b8,local_98,local_d4);
        pGVar7->Value = uVar1;
      }
    }
  }
  else {
    Gia_ManCleanMark0(p);
    for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
      pGVar7 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
           *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) | 0x40000000;
    }
    local_c8 = 0;
    local_dc = local_d4;
    uVar10 = 0;
    if (0 < (int)local_d4) {
      uVar10 = (ulong)local_d4;
    }
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar7 = Gia_ManObj(p,iVar9);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      uVar1 = (uint)*(undefined8 *)pGVar7;
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        if ((uVar1 >> 0x1e & 1) == 0) {
          iVar2 = Gia_ObjFanin0Copy(pGVar7);
          iVar3 = Gia_ObjFanin1Copy(pGVar7);
          uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
          pGVar7->Value = uVar1;
        }
        else {
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            iVar2 = Gia_ManAppendCi(p_00);
            local_b8[uVar11] = iVar2;
          }
          local_d0 = Gia_ObjFanin0Copy(pGVar7);
          local_cc = Gia_ObjFanin1Copy(pGVar7);
          uVar1 = Gia_ManRealizeFormula(p_00,&local_d0,local_b8,local_98,local_d4);
          pGVar7->Value = uVar1;
          local_c8 = (ulong)((int)local_c8 + 1);
        }
      }
    }
    for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
      pGVar7 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
           *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) &
           0xffffffffbfffffff;
    }
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar7 = Gia_ManCo(p,iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar7);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar7->Value = uVar1;
  }
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar9 = pGVar8->vCis->nSize;
  iVar2 = pGVar8->nRegs;
  iVar3 = p->vCis->nSize;
  iVar4 = (int)local_c8;
  if (fFfOnly == 0) {
    iVar4 = Gia_ManAndNum(p);
  }
  if (iVar9 - iVar2 == iVar4 * local_dc + iVar3) {
    return pGVar8;
  }
  __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x37d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
}

Assistant:

Gia_Man_t * Gia_ManFormulaUnfold( Gia_Man_t * p, char * pForm, int fFfOnly )
{
    char pStr[100];
    int Count = 0;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, k, iCtrl[FFTEST_MAX_PARS], iFans[FFTEST_MAX_VARS];
    int nVars, nPars;
    assert( strlen(pForm) < 100 );
    Gia_FormStrCount( pForm, &nVars, &nPars );
    assert( nVars == 2 );
    Gia_FormStrTransform( pStr, pForm );
    Gia_ManPrintFormula( pStr );
    pNew = Gia_ManStart( 5 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManCleanMark0( p );
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( pObj->fMark0 )
            {
                for ( k = 0; k < nPars; k++ )
                    iCtrl[k] = Gia_ManAppendCi(pNew);
                iFans[0] = Gia_ObjFanin0Copy(pObj);
                iFans[1] = Gia_ObjFanin1Copy(pObj);
                pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
                Count++;
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 0;
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            for ( k = 0; k < nPars; k++ )
                iCtrl[k] = Gia_ManAppendCi(pNew);
            iFans[0] = Gia_ObjFanin0Copy(pObj);
            iFans[1] = Gia_ObjFanin1Copy(pObj);
            pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p)) );
//    if ( fUseFaults )
//        Gia_AigerWrite( pNew, "newfault.aig", 0, 0, 0 );
    return pNew;
}